

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver.hpp
# Opt level: O2

results_type * __thiscall
asio::ip::
basic_resolver<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
::resolve(results_type *__return_storage_ptr__,
         basic_resolver<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
         *this,string *host,string *service,flags resolve_flags)

{
  error_code ec;
  basic_resolver_query<asio::ip::tcp> q;
  error_code local_e8;
  string local_d8;
  string local_b8;
  basic_resolver_query<asio::ip::tcp> local_98;
  
  local_e8._M_value = 0;
  local_e8._M_cat = (error_category *)std::_V2::system_category();
  std::__cxx11::string::string((string *)&local_b8,(string *)host);
  std::__cxx11::string::string((string *)&local_d8,(string *)service);
  basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&local_98,&local_b8,&local_d8,resolve_flags);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  asio::detail::resolver_service<asio::ip::tcp>::resolve
            (__return_storage_ptr__,(this->impl_).service_,&(this->impl_).implementation_,&local_98,
             &local_e8);
  asio::detail::throw_error(&local_e8,"resolve");
  basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(&local_98);
  return __return_storage_ptr__;
}

Assistant:

results_type resolve(ASIO_STRING_VIEW_PARAM host,
      ASIO_STRING_VIEW_PARAM service, resolver_base::flags resolve_flags)
  {
    asio::error_code ec;
    basic_resolver_query<protocol_type> q(static_cast<std::string>(host),
        static_cast<std::string>(service), resolve_flags);
    results_type r = impl_.get_service().resolve(
        impl_.get_implementation(), q, ec);
    asio::detail::throw_error(ec, "resolve");
    return r;
  }